

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O2

bool __thiscall
QFormLayoutPrivate::setItem(QFormLayoutPrivate *this,int row,ItemRole role,QLayoutItem *item)

{
  QFormLayoutItem **ppQVar1;
  QFormLayoutItem *this_00;
  ItemRole c;
  char *pcVar2;
  bool bVar3;
  long in_FS_OFFSET;
  char local_58 [24];
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  c = FieldRole;
  if (role != SpanningRole) {
    c = role;
  }
  if ((c < SpanningRole) && ((uint)row < (uint)((ulong)(this->m_matrix).m_storage.d.size >> 1))) {
    if (item == (QLayoutItem *)0x0) {
      bVar3 = false;
      goto LAB_0037bcd0;
    }
    ppQVar1 = QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::operator()(&this->m_matrix,row,c);
    if (*ppQVar1 == (QFormLayoutItem *)0x0) {
      this_00 = (QFormLayoutItem *)operator_new(0x40);
      QFormLayoutItem::QFormLayoutItem(this_00,item);
      this_00->fullRow = role == SpanningRole;
      ppQVar1 = QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::operator()
                          (&this->m_matrix,row,c);
      *ppQVar1 = this_00;
      QList<QFormLayoutItem_*>::append(&this->m_things,this_00);
      bVar3 = true;
      goto LAB_0037bcd0;
    }
    pcVar2 = "QFormLayoutPrivate::setItem: Cell (%d, %d) already occupied";
  }
  else {
    pcVar2 = "QFormLayoutPrivate::setItem: Invalid cell (%d, %d)";
  }
  local_40 = "default";
  local_58[0x14] = '\0';
  local_58[0x15] = '\0';
  local_58[0x16] = '\0';
  local_58[0x17] = '\0';
  local_58[0xc] = '\0';
  local_58[0xd] = '\0';
  local_58[0xe] = '\0';
  local_58[0xf] = '\0';
  local_58[0x10] = '\0';
  local_58[0x11] = '\0';
  local_58[0x12] = '\0';
  local_58[0x13] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  local_58[8] = '\0';
  local_58[9] = '\0';
  local_58[10] = '\0';
  local_58[0xb] = '\0';
  local_58[0] = '\x02';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  bVar3 = false;
  QMessageLogger::warning(local_58,pcVar2,row,(ulong)c);
LAB_0037bcd0:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QFormLayoutPrivate::setItem(int row, QFormLayout::ItemRole role, QLayoutItem *item)
{
    const bool fullRow = role == QFormLayout::SpanningRole;
    const int column =  role == QFormLayout::SpanningRole ? 1 : static_cast<int>(role);
    if (Q_UNLIKELY(uint(row) >= uint(m_matrix.rowCount()) || uint(column) > 1U)) {
        qWarning("QFormLayoutPrivate::setItem: Invalid cell (%d, %d)", row, column);
        return false;
    }

    if (!item)
        return false;

    if (Q_UNLIKELY(m_matrix(row, column))) {
        qWarning("QFormLayoutPrivate::setItem: Cell (%d, %d) already occupied", row, column);
        return false;
    }

    QFormLayoutItem *i = new QFormLayoutItem(item);
    i->fullRow = fullRow;
    m_matrix(row, column) = i;

    m_things.append(i);
    return true;
}